

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O3

void StartGame(void)

{
  int iVar1;
  string key;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  selectionLevel[4] = false;
  selectionLevel[0] = false;
  selectionLevel[1] = false;
  selectionLevel[2] = false;
  selectionLevel[3] = false;
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  if (400 < Points) goto LAB_00103079;
  do {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1f3a,0x1d);
      SelectLevel();
      TimeChoose();
      Flag = 1;
      while ((Flag != 0 && (Points < 0x191))) {
        SetTask();
      }
    } while (Points < 0x191);
LAB_00103079:
    levelFive_abi_cxx11_[99].field_2._M_local_buf[(long)Token + 0xf] = '\x01';
    PrintGameMenu();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_1f44,0x78);
    std::operator>>((istream *)&std::cin,(string *)&local_88);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_88 + local_80);
    InputCheck(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_88 + local_80);
    iVar1 = InputCheck(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 == 99) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GAME OVER\n",10);
    }
    Points = 0;
  } while( true );
}

Assistant:

void StartGame()
{
    selectionLevel[0] = false;
    selectionLevel[1] = false;
    selectionLevel[2] = false;
    selectionLevel[3] = false;
    selectionLevel[4] = false;
    string key;



    while (1) {
        while (Points <= 400) {
            cout << "Выбор уровня 1 - 5";
            SelectLevel();

            TimeChoose();
            Flag = 1;
            while ((Flag != 0) && (Points <= 400)) {
                SetTask();
            }
        }
        selectionLevel[Token - 1] = true;

        PrintGameMenu();
        cout << "Продолжишь или нет?Если да то введи любую кнопку ,если нет "
                "введи "
                "99\n";
        cin >> key;
        InputCheck(key);
        if(InputCheck(key)==99) {
            cout << "GAME OVER\n";
        }
        Points = 0;
    }

}